

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Cluster::DoWriteFrame(Cluster *this,Frame *frame)

{
  mapped_type mVar1;
  bool bVar2;
  uint64 uVar3;
  mapped_type *pmVar4;
  uint64_t local_20;
  
  if (frame == (Frame *)0x0) {
    return false;
  }
  bVar2 = Frame::IsValid(frame);
  if ((((bVar2) && (this->finalized_ == false)) &&
      ((this->header_written_ != false || (bVar2 = WriteClusterHeader(this), bVar2)))) &&
     (uVar3 = WriteFrame(this->writer_,frame,this), uVar3 != 0)) {
    this->payload_size_ = this->payload_size_ + uVar3;
    this->blocks_added_ = this->blocks_added_ + 1;
    mVar1 = frame->timestamp_;
    local_20 = frame->track_number_;
    pmVar4 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->last_block_timestamp_,&local_20);
    *pmVar4 = mVar1;
    return true;
  }
  return false;
}

Assistant:

bool Cluster::DoWriteFrame(const Frame* const frame) {
  if (!frame || !frame->IsValid())
    return false;

  if (!PreWriteBlock())
    return false;

  const uint64_t element_size = WriteFrame(writer_, frame, this);
  if (element_size == 0)
    return false;

  PostWriteBlock(element_size);
  last_block_timestamp_[frame->track_number()] = frame->timestamp();
  return true;
}